

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void vmaDestroyVirtualBlock(VmaVirtualBlock virtualBlock)

{
  VkAllocationCallbacks allocationCallbacks;
  VkAllocationCallbacks local_48;
  
  if (virtualBlock != (VmaVirtualBlock)0x0) {
    local_48.pUserData = (virtualBlock->m_AllocationCallbacks).pUserData;
    local_48.pfnAllocation = (virtualBlock->m_AllocationCallbacks).pfnAllocation;
    local_48.pfnReallocation = (virtualBlock->m_AllocationCallbacks).pfnReallocation;
    local_48.pfnFree = (virtualBlock->m_AllocationCallbacks).pfnFree;
    local_48.pfnInternalAllocation = (virtualBlock->m_AllocationCallbacks).pfnInternalAllocation;
    local_48.pfnInternalFree = (virtualBlock->m_AllocationCallbacks).pfnInternalFree;
    VmaVirtualBlock_T::~VmaVirtualBlock_T(virtualBlock);
    VmaFree(&local_48,virtualBlock);
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyVirtualBlock(VmaVirtualBlock VMA_NULLABLE virtualBlock)
{
    if(virtualBlock != VK_NULL_HANDLE)
    {
        VMA_DEBUG_LOG("vmaDestroyVirtualBlock");
        VMA_DEBUG_GLOBAL_MUTEX_LOCK;
        VkAllocationCallbacks allocationCallbacks = virtualBlock->m_AllocationCallbacks; // Have to copy the callbacks when destroying.
        vma_delete(&allocationCallbacks, virtualBlock);
    }
}